

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_log_callback ma_log_callback_init(ma_log_callback_proc onLog,void *pUserData)

{
  ma_log_callback mVar1;
  void *in_RSI;
  ma_log_callback_proc in_RDI;
  ma_log_callback callback;
  undefined1 local_20 [16];
  undefined8 local_10;
  undefined1 *local_8;
  
  local_8 = local_20;
  local_10 = 0x10;
  if (local_8 != (undefined1 *)0x0) {
    memset(local_8,0,0x10);
  }
  mVar1.pUserData = in_RSI;
  mVar1.onLog = in_RDI;
  return mVar1;
}

Assistant:

MA_API ma_log_callback ma_log_callback_init(ma_log_callback_proc onLog, void* pUserData)
{
    ma_log_callback callback;

    MA_ZERO_OBJECT(&callback);
    callback.onLog     = onLog;
    callback.pUserData = pUserData;

    return callback;
}